

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Body::Body(Body *this,Point *p,PObject n)

{
  Body *local_38 [3];
  PObject local_20;
  PObject n_local;
  Point *p_local;
  Body *this_local;
  
  local_20 = n;
  n_local = (PObject)p;
  p_local = (Point *)this;
  Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_0010ecc0;
  Point::Point(&this->last);
  (this->super_Object).ch = 'O';
  Point::operator=(&(this->super_Object).position,(Point *)n_local);
  this->next = local_20;
  local_38[0] = this;
  std::vector<Object_*,_std::allocator<Object_*>_>::push_back(&Object::obj,(value_type *)local_38);
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Body::Body(const Point& p, PObject n){
	ch = CHR_BODY;
	position = p;
	next = n;
	obj.push_back(this);
	on_map = true;
}